

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

string * __thiscall
tinyusdz::Stage::dump_prim_tree_abi_cxx11_(string *__return_storage_ptr__,Stage *this)

{
  pointer pPVar1;
  uint32_t in_ECX;
  Prim *root;
  pointer this_00;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pPVar1) {
    do {
      (anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
                (&local_1d8,(_anonymous_namespace_ *)this_00,(Prim *)0x0,in_ECX);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Stage::dump_prim_tree() const {
  std::stringstream ss;

  for (const Prim &root : root_prims()) {
    ss << DumpPrimTreeRec(root, 0);
  }
  return ss.str();
}